

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_manager.cpp
# Opt level: O1

void __thiscall
duckdb::RelationManager::AddRelation
          (RelationManager *this,LogicalOperator *op,
          optional_ptr<duckdb::LogicalOperator,_true> parent,RelationStats *stats)

{
  pointer puVar1;
  pointer puVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  ColumnBinding *binding;
  __node_base_ptr *__k;
  __node_base _Var5;
  mapped_type mVar6;
  templated_unique_single_t relation;
  vector<unsigned_long,_true> table_indexes;
  vector<duckdb::ColumnBinding,_true> bindings;
  _Head_base<0UL,_duckdb::SingleJoinRelation_*,_false> local_90;
  long *local_88;
  long *local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  optional_ptr<duckdb::LogicalOperator,_true> local_38;
  
  local_38.ptr = parent.ptr;
  make_uniq<duckdb::SingleJoinRelation,duckdb::LogicalOperator&,duckdb::optional_ptr<duckdb::LogicalOperator,true>&,duckdb::RelationStats_const&>
            ((duckdb *)&local_90,op,&local_38,stats);
  puVar1 = (this->relations).
           super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->relations).
           super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (*op->_vptr_LogicalOperator[0xd])(&local_88,op);
  mVar6 = (long)puVar1 - (long)puVar2 >> 3;
  if (local_88 == local_80) {
    local_70._M_buckets = &local_70._M_single_bucket;
    local_70._M_bucket_count = (size_type)&DAT_00000001;
    local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_70._M_element_count = 0;
    local_70._M_rehash_policy._M_max_load_factor = 1.0;
    local_70._M_rehash_policy._M_next_resize = 0;
    local_70._M_single_bucket = (__node_base_ptr)0x0;
    LogicalJoin::GetTableReferences
              (op,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_70);
    for (_Var5._M_nxt = local_70._M_before_begin._M_nxt; _Var5._M_nxt != (_Hash_node_base *)0x0;
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
      pmVar4 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,(key_type *)(_Var5._M_nxt + 1));
      *pmVar4 = mVar6;
    }
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_70);
  }
  else if (op->type == LOGICAL_UNNEST) {
    (*op->_vptr_LogicalOperator[2])(&local_70,op);
    sVar3 = local_70._M_bucket_count;
    for (__k = local_70._M_buckets; __k != (__node_base_ptr *)sVar3; __k = __k + 2) {
      pmVar4 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,(key_type *)__k);
      *pmVar4 = mVar6;
    }
    if (local_70._M_buckets != (__node_base_ptr *)0x0) {
      operator_delete(local_70._M_buckets);
    }
  }
  else {
    if (local_80 == local_88) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    local_70._M_buckets = (__buckets_ptr)*local_88;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)&local_70);
    *pmVar4 = mVar6;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,std::default_delete<duckdb::SingleJoinRelation>,true>,std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,std::default_delete<duckdb::SingleJoinRelation>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::SingleJoinRelation,std::default_delete<duckdb::SingleJoinRelation>,true>>
            ((vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,std::default_delete<duckdb::SingleJoinRelation>,true>,std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,std::default_delete<duckdb::SingleJoinRelation>,true>>>
              *)&this->relations,
             (unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>
              *)&local_90);
  op->estimated_cardinality = stats->cardinality;
  op->has_estimated_cardinality = true;
  if (local_88 != (long *)0x0) {
    operator_delete(local_88);
  }
  if (local_90._M_head_impl != (SingleJoinRelation *)0x0) {
    ::std::default_delete<duckdb::SingleJoinRelation>::operator()
              ((default_delete<duckdb::SingleJoinRelation> *)&local_90,local_90._M_head_impl);
  }
  return;
}

Assistant:

void RelationManager::AddRelation(LogicalOperator &op, optional_ptr<LogicalOperator> parent,
                                  const RelationStats &stats) {

	// if parent is null, then this is a root relation
	// if parent is not null, it should have multiple children
	D_ASSERT(!parent || parent->children.size() >= 2);
	auto relation = make_uniq<SingleJoinRelation>(op, parent, stats);
	auto relation_id = relations.size();

	auto table_indexes = op.GetTableIndex();
	if (table_indexes.empty()) {
		// relation represents a non-reorderable relation, most likely a join relation
		// Get the tables referenced in the non-reorderable relation and add them to the relation mapping
		// This should all table references, even if there are nested non-reorderable joins.
		unordered_set<idx_t> table_references;
		LogicalJoin::GetTableReferences(op, table_references);
		D_ASSERT(table_references.size() > 0);
		for (auto &reference : table_references) {
			D_ASSERT(relation_mapping.find(reference) == relation_mapping.end());
			relation_mapping[reference] = relation_id;
		}
	} else if (op.type == LogicalOperatorType::LOGICAL_UNNEST) {
		// logical unnest has a logical_unnest index, but other bindings can refer to
		// columns that are not unnested.
		auto bindings = op.GetColumnBindings();
		for (auto &binding : bindings) {
			relation_mapping[binding.table_index] = relation_id;
		}
	} else {
		// Relations should never return more than 1 table index
		D_ASSERT(table_indexes.size() == 1);
		idx_t table_index = table_indexes.at(0);
		D_ASSERT(relation_mapping.find(table_index) == relation_mapping.end());
		relation_mapping[table_index] = relation_id;
	}
	relations.push_back(std::move(relation));
	op.estimated_cardinality = stats.cardinality;
	op.has_estimated_cardinality = true;
}